

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdfjob-c.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  char *p;
  char *pcStack_68;
  int r;
  char *new_argv [7];
  char *outfile;
  char *infile;
  char **argv_local;
  int argc_local;
  
  pcVar2 = strrchr(*argv,0x2f);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strrchr(*argv,0x5c);
    if (pcVar2 == (char *)0x0) {
      whoami = *argv;
    }
    else {
      whoami = pcVar2 + 1;
    }
  }
  else {
    whoami = pcVar2 + 1;
  }
  if (argc != 3) {
    usage();
  }
  new_argv[0] = argv[1];
  new_argv[1] = argv[2];
  pcStack_68 = "qpdfjob";
  new_argv[2] = "--linearize";
  new_argv[3] = "--static-id";
  new_argv[4] = "--compress-streams=n";
  new_argv[5] = (char *)0x0;
  iVar1 = qpdfjob_run_from_argv(&stack0xffffffffffffff98);
  return iVar1;
}

Assistant:

int
main(int argc, char* argv[])
{
    char* infile = NULL;
    char* outfile = NULL;
    char const* new_argv[7];
    int r = 0;
    char* p = 0;

    if ((p = strrchr(argv[0], '/')) != NULL) {
        whoami = p + 1;
    } else if ((p = strrchr(argv[0], '\\')) != NULL) {
        whoami = p + 1;
    } else {
        whoami = argv[0];
    }

    if (argc != 3) {
        usage();
    }

    infile = argv[1];
    outfile = argv[2];

    new_argv[0] = "qpdfjob";
    new_argv[1] = infile;
    new_argv[2] = outfile;
    new_argv[3] = "--linearize";
    new_argv[4] = "--static-id";          /* for testing only */
    new_argv[5] = "--compress-streams=n"; /* avoid dependency on zlib output */
    new_argv[6] = NULL;

    /* See qpdf-job.cc for a C++ example of using the json interface. To use that from C just like
     * the argv one, call qpdfjob_run_from_json instead and pass the json string as a single char
     * const* argument.
     *
     * See qpdfjob-c-save-attachment.c for an example of using the full form of the qpdfjob
     * interface with init and cleanup functions.
     */
    r = qpdfjob_run_from_argv(new_argv);
    return r;
}